

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesturemanager.cpp
# Opt level: O0

bool logIgnoredEvent(Type t)

{
  bool result;
  Type t_local;
  
  result = false;
  if ((((t - MouseButtonPress < 4) || (t == TabletMove)) || (t - TabletPress < 2)) ||
     (((t - GraphicsSceneMouseMove < 4 || (t - TabletEnterProximity < 2)) ||
      ((t - TouchBegin < 3 || (t == TouchCancel)))))) {
    result = true;
  }
  return result;
}

Assistant:

static bool logIgnoredEvent(QEvent::Type t)
{
    bool result = false;
    switch (t) {
    case QEvent::MouseButtonPress:
    case QEvent::MouseButtonRelease:
    case QEvent::MouseButtonDblClick:
    case QEvent::MouseMove:
    case QEvent::TouchBegin:
    case QEvent::TouchUpdate:
    case QEvent::TouchCancel:
    case QEvent::TouchEnd:
    case QEvent::TabletEnterProximity:
    case QEvent::TabletLeaveProximity:
    case QEvent::TabletMove:
    case QEvent::TabletPress:
    case QEvent::TabletRelease:
    case QEvent::GraphicsSceneMouseDoubleClick:
    case QEvent::GraphicsSceneMousePress:
    case QEvent::GraphicsSceneMouseRelease:
    case QEvent::GraphicsSceneMouseMove:
        result = true;
        break;
    default:
        break;

    }
    return result;
}